

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

void entryClose(UResourceDataEntry *resB)

{
  UResourceDataEntry **ppUVar1;
  
  umtx_lock_63(&resbMutex);
  if (resB != (UResourceDataEntry *)0x0) {
    do {
      ppUVar1 = &resB->fParent;
      resB->fCountExisting = resB->fCountExisting - 1;
      resB = *ppUVar1;
    } while (*ppUVar1 != (UResourceDataEntry *)0x0);
  }
  umtx_unlock_63(&resbMutex);
  return;
}

Assistant:

static void entryClose(UResourceDataEntry *resB) {
  umtx_lock(&resbMutex);
  entryCloseInt(resB);
  umtx_unlock(&resbMutex);
}